

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintTo(char32_t c,ostream *os)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>(os,"U+",2);
  pp_Var2 = os->_vptr_basic_ostream;
  *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) =
       *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) | 0x4000;
  p_Var1 = (_func_int *)((long)&os->_vptr_basic_ostream + (long)pp_Var2[-3]);
  if ((&os->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
    std::ios::widen((char)p_Var1);
    p_Var1[0xe1] = (code)0x1;
    pp_Var2 = os->_vptr_basic_ostream;
  }
  p_Var1[0xe0] = (code)0x30;
  *(undefined8 *)(&os->field_0x10 + (long)pp_Var2[-3]) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  return;
}

Assistant:

void PrintTo(char32_t c, ::std::ostream* os) {
  *os << std::hex << "U+" << std::uppercase << std::setfill('0') << std::setw(4)
      << static_cast<uint32_t>(c);
}